

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void bitset_set_lenrange(uint64_t *words,uint32_t start,uint32_t lenminusone)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  uint local_2c;
  uint32_t i;
  uint64_t temp;
  uint32_t endword;
  uint32_t firstword;
  uint32_t lenminusone_local;
  uint32_t start_local;
  uint64_t *words_local;
  
  local_2c = start >> 6;
  uVar3 = start + lenminusone >> 6;
  bVar2 = (byte)start;
  if (local_2c == uVar3) {
    words[local_2c] =
         (0xffffffffffffffffU >> (0x3fU - (char)lenminusone & 0x3f)) << (bVar2 & 0x3f) |
         words[local_2c];
  }
  else {
    uVar1 = words[uVar3];
    words[local_2c] = -1L << (bVar2 & 0x3f) | words[local_2c];
    for (local_2c = local_2c + 1; local_2c < uVar3; local_2c = local_2c + 2) {
      words[local_2c + 1] = 0xffffffffffffffff;
      words[local_2c] = 0xffffffffffffffff;
    }
    words[uVar3] = uVar1 | 0xffffffffffffffffU >> ((bVar2 ^ 0xff) - (char)lenminusone & 0x3f);
  }
  return;
}

Assistant:

static inline void bitset_set_lenrange(uint64_t *words, uint32_t start,
                                       uint32_t lenminusone) {
    uint32_t firstword = start / 64;
    uint32_t endword = (start + lenminusone) / 64;
    if (firstword == endword) {
        words[firstword] |= ((~UINT64_C(0)) >> ((63 - lenminusone) % 64))
                             << (start % 64);
        return;
    }
    uint64_t temp = words[endword];
    words[firstword] |= (~UINT64_C(0)) << (start % 64);
    for (uint32_t i = firstword + 1; i < endword; i += 2)
        words[i] = words[i + 1] = ~UINT64_C(0);
    words[endword] =
        temp | (~UINT64_C(0)) >> (((~start + 1) - lenminusone - 1) % 64);
}